

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_2.h
# Opt level: O2

bool __thiscall
dlib::
binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::move_next(binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::output_streambuf_container,_std::default_delete<dlib::logger::global_data::output_streambuf_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this)

{
  node *pnVar1;
  node *pnVar2;
  node *pnVar3;
  node *pnVar4;
  bool bVar5;
  
  if (this->at_start_ == true) {
    this->at_start_ = false;
    if (this->tree_size == 0) {
      return false;
    }
    pnVar4 = this->tree_root;
    do {
      pnVar3 = pnVar4;
      pnVar4 = pnVar3->left;
    } while (pnVar4 != this->NIL);
    this->current_element = pnVar3;
    return true;
  }
  pnVar4 = this->current_element;
  if (pnVar4 == (node *)0x0) {
    return false;
  }
  pnVar3 = pnVar4->right;
  pnVar1 = this->NIL;
  if (pnVar3 == pnVar1) {
    pnVar2 = pnVar4->parent;
    if (pnVar2 == pnVar3) {
LAB_002654bc:
      this->current_element = (node *)0x0;
      return false;
    }
    bVar5 = pnVar2->left == pnVar4;
  }
  else {
    bVar5 = false;
    pnVar2 = pnVar3;
  }
  do {
    while (pnVar4 = pnVar2, pnVar3 == pnVar1) {
      if (bVar5) goto LAB_002654b5;
      pnVar2 = pnVar4->parent;
      bVar5 = pnVar2->left == pnVar4;
      if (pnVar2 == pnVar3) goto LAB_002654bc;
    }
    pnVar2 = pnVar4->left;
  } while (pnVar4->left != pnVar1);
LAB_002654b5:
  this->current_element = pnVar4;
  return true;
}

Assistant:

bool binary_search_tree_kernel_2<domain,range,mem_manager,compare>::
    move_next (
    ) const
    {
        // if we haven't started iterating yet
        if (at_start_)
        {
            at_start_ = false;
            if (tree_size == 0)
            {
                return false;
            }
            else
            {
                // find the first element in the tree
                current_element = tree_root;
                node* temp = current_element->left;
                while (temp != NIL)
                {
                    current_element = temp;
                    temp = current_element->left;
                }
                return true;
            }
        }
        else
        {
            if (current_element == 0)
            {
                return false;
            }
            else
            {
                bool went_up;  // true if we went up the tree from a child node to parent
                bool from_left = false; // true if we went up and were coming from a left child node
                // find the next element in the tree
                if (current_element->right != NIL)
                {
                    // go right and down                    
                    current_element = current_element->right;
                    went_up = false;
                }
                else
                {
                    went_up = true;
                    node* parent = current_element->parent;
                    if (parent == NIL)
                    {
                        // in this case we have iterated over all the element of the tree
                        current_element = 0;
                        return false;
                    }

                    from_left = (parent->left == current_element);
                    // go up to parent
                    current_element = parent;
                }


                while (true)
                {
                    if (went_up)
                    {
                        if (from_left)
                        {
                            // in this case we have found the next node
                            break;
                        }
                        else
                        {
                            // we should go up
                            node* parent = current_element->parent;
                            from_left = (parent->left == current_element);                            
                            current_element = parent;
                            if (current_element == NIL)
                            {
                                // in this case we have iterated over all the elements
                                // in the tree
                                current_element = 0;
                                return false;
                            }
                        }
                    }
                    else
                    {
                        // we just went down to a child node
                        if (current_element->left != NIL)
                        {
                            // go left
                            went_up = false;
                            current_element = current_element->left;
                        }
                        else
                        {
                            // if there is no left child then we have found the next node
                            break;
                        }
                    }
                }

                return true;               
            }
        }
    }